

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts_main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  string output_path;
  string input_path;
  VpxPes2Ts converter;
  string local_b8;
  string local_98;
  VpxPes2Ts local_78;
  
  if (argc < 3) {
    printf("Usage: %s <WebM file> <output file>",*argv);
    uVar2 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_98,argv[1],(allocator *)&local_78);
    std::__cxx11::string::string((string *)&local_b8,argv[2],(allocator *)&local_78);
    libwebm::VpxPes2Ts::VpxPes2Ts(&local_78,&local_98,&local_b8);
    bVar1 = libwebm::VpxPes2Ts::ConvertToFile(&local_78);
    libwebm::VpxPes2Ts::~VpxPes2Ts(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    uVar2 = (uint)!bVar1;
  }
  return uVar2;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 3) {
    Usage(argv);
    return EXIT_FAILURE;
  }

  const std::string input_path = argv[1];
  const std::string output_path = argv[2];

  libwebm::VpxPes2Ts converter(input_path, output_path);
  return converter.ConvertToFile() == true ? EXIT_SUCCESS : EXIT_FAILURE;
}